

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  long in_RSI;
  long in_RDI;
  lua_Debug *unaff_retaddr;
  TValue *o;
  char *name;
  char *local_38;
  GCproto *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  char **in_stack_fffffffffffffff8;
  
  local_38 = (char *)0x0;
  if (in_RSI == 0) {
    if ((*(int *)(*(long *)(in_RDI + 0x18) + -4) == -9) &&
       (*(char *)((ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8) + 6) == '\0')) {
      local_38 = debug_varname(in_stack_ffffffffffffffe8,(BCPos)((ulong)in_RDI >> 0x20),
                               (BCReg)in_RDI);
    }
  }
  else {
    debug_localname((lua_State *)&o->field_2,unaff_retaddr,in_stack_fffffffffffffff8,
                    (BCReg)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  }
  return local_38;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  if (ar) {
    TValue *o = debug_localname(L, ar, &name, (BCReg)n);
    if (name) {
      copyTV(L, L->top, o);
      incr_top(L);
    }
  } else if (tvisfunc(L->top-1) && isluafunc(funcV(L->top-1))) {
    name = debug_varname(funcproto(funcV(L->top-1)), 0, (BCReg)n-1);
  }
  return name;
}